

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadCompressedBuffer
          (ON_BinaryArchive *this,size_t sizeof__outbuffer,void *outbuffer,bool *bFailedCRC)

{
  bool bVar1;
  uint in_EAX;
  ON__UINT32 OVar2;
  char method;
  uint buffer_crc0;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)(in_EAX & 0xffffff);
  if (bFailedCRC != (bool *)0x0) {
    *bFailedCRC = false;
  }
  bVar1 = ReadMode(this);
  if (bVar1) {
    if (sizeof__outbuffer == 0) {
      return true;
    }
    if ((((outbuffer != (void *)0x0) &&
         (bVar1 = ReadInt(this,(ON__UINT32 *)((long)&uStack_38 + 4)), bVar1)) &&
        (bVar1 = ReadChar(this,(char *)((long)&uStack_38 + 3)), bVar1)) && (uStack_38._3_1_ < 2)) {
      if ((uStack_38 & 0x1000000) == 0) {
        bVar1 = ReadByte(this,sizeof__outbuffer,outbuffer);
        if (bVar1) {
LAB_0068e0b9:
          OVar2 = ON_CRC32(0,sizeof__outbuffer,outbuffer);
          if (OVar2 == uStack_38._4_4_) {
            return true;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_zlib.cpp"
                     ,0xd1,"","ON_BinaryArchive::ReadCompressedBuffer() crc error");
          if (bFailedCRC == (bool *)0x0) {
            return true;
          }
          *bFailedCRC = true;
          return true;
        }
      }
      else {
        bVar1 = CompressionInit(this);
        if (bVar1) {
          bVar1 = ReadInflate(this,sizeof__outbuffer,outbuffer);
          CompressionEnd(this);
          if (bVar1) goto LAB_0068e0b9;
        }
        else {
          CompressionEnd(this);
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadCompressedBuffer( // read and uncompress
  size_t sizeof__outbuffer,  // sizeof of uncompressed buffer to read
  void* outbuffer,           // uncompressed output data returned here
  bool* bFailedCRC
  )
{
  bool rc = false;
  unsigned int buffer_crc0 = 0;
  unsigned int buffer_crc1 = 0;
  char method = 0;

  if ( bFailedCRC)
    *bFailedCRC = false;
  if ( !ReadMode() )
    return false;
  if ( 0 == sizeof__outbuffer )
    return true;
  if ( 0 == outbuffer )
    return false;

  if ( !ReadInt(&buffer_crc0) ) // 32 bit crc of uncompressed buffer
    return false;

  if ( !ReadChar(&method) )
    return false;

  if ( method != 0 && method != 1 )
    return false;

  switch(method)
  {
  case 0: // uncompressed
    rc = ReadByte(sizeof__outbuffer, outbuffer);
    break;
  case 1: // compressed
    rc = CompressionInit();
    if (rc)
      rc = ReadInflate( sizeof__outbuffer, outbuffer );
    CompressionEnd();
    break;
  }

  if (rc ) 
  {
    buffer_crc1 = ON_CRC32( 0, sizeof__outbuffer, outbuffer );
    if ( buffer_crc1 != buffer_crc0 ) 
    {
      ON_ERROR("ON_BinaryArchive::ReadCompressedBuffer() crc error");
      if ( bFailedCRC )
        *bFailedCRC = true;
    }
  }

  return rc;
}